

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bidi_test.c
# Opt level: O2

char * extract_word(char **ptr)

{
  ushort **ppuVar1;
  byte *pbVar2;
  ulong uVar3;
  byte *pbVar4;
  byte *pbVar5;
  
  pbVar4 = (byte *)*ptr;
  while ((uVar3 = (ulong)*pbVar4, pbVar2 = pbVar4, uVar3 != 0 &&
         (ppuVar1 = __ctype_b_loc(), (*(byte *)((long)*ppuVar1 + uVar3 * 2 + 1) & 0x20) != 0))) {
    pbVar4 = pbVar4 + 1;
  }
  while (pbVar5 = pbVar2 + 1, (char)uVar3 != '\0') {
    ppuVar1 = __ctype_b_loc();
    if ((*(byte *)((long)*ppuVar1 + uVar3 * 2 + 1) & 0x20) != 0) {
      *pbVar2 = 0;
      goto LAB_00101aa5;
    }
    pbVar2 = pbVar5;
    uVar3 = (ulong)*pbVar5;
  }
  goto LAB_00101abf;
  while (pbVar5 = pbVar2 + 1, (*(byte *)((long)*ppuVar1 + (ulong)*pbVar2 * 2 + 1) & 0x20) != 0) {
LAB_00101aa5:
    pbVar2 = pbVar5;
    if ((ulong)*pbVar2 == 0) break;
  }
LAB_00101abf:
  *ptr = (char *)pbVar2;
  return (char *)pbVar4;
}

Assistant:

static const char *extract_word(char **ptr)
{
    char *p = *ptr;
    while (*p && isspace((unsigned char)*p)) p++;

    char *start = p;
    while (*p && !isspace((unsigned char)*p)) p++;

    if (*p) {
        *p++ = '\0';
        while (*p && isspace((unsigned char)*p)) p++;
    }

    *ptr = p;
    return start;
}